

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

bool vkt::api::anon_unknown_0::executeCommandBuffer
               (VkDevice device,DeviceInterface *vk,VkQueue queue,VkCommandBuffer commandBuffer,
               bool exitBeforeEndCommandBuffer)

{
  VkResult VVar1;
  int iVar2;
  bool bVar3;
  VkCommandBuffer commandBuffer_local;
  RefBase<vk::Handle<(vk::HandleType)6>_> local_e8;
  RefBase<vk::Handle<(vk::HandleType)10>_> local_c8;
  VkSubmitInfo submitInfo;
  VkCommandBufferBeginInfo commandBufferBeginInfo;
  
  commandBuffer_local = commandBuffer;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_c8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_c8.m_data.object.m_internal = submitInfo._0_8_;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)10>_> *)&submitInfo);
  VVar1 = (*vk->_vptr_DeviceInterface[0x49])(vk,commandBuffer);
  ::vk::checkResult(VVar1,"vk.beginCommandBuffer(commandBuffer, &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x260);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,commandBuffer,local_c8.m_data.object.m_internal,0x10000);
  bVar3 = true;
  if (!exitBeforeEndCommandBuffer) {
    VVar1 = (*vk->_vptr_DeviceInterface[0x4a])(vk,commandBuffer);
    ::vk::checkResult(VVar1,"vk.endCommandBuffer(commandBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x267);
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,device,0,
                      (VkAllocationCallbacks *)0x0);
    local_e8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
    local_e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
    local_e8.m_data.object.m_internal = submitInfo._0_8_;
    local_e8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
    submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfo._4_4_ = 0;
    submitInfo.pNext = (void *)0x0;
    submitInfo.waitSemaphoreCount = 0;
    submitInfo._20_4_ = 0;
    submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&submitInfo);
    submitInfo.pNext = (void *)0x0;
    submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
    submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
    submitInfo.signalSemaphoreCount = 0;
    submitInfo._60_4_ = 0;
    submitInfo.waitSemaphoreCount = 0;
    submitInfo._20_4_ = 0;
    submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submitInfo._4_4_ = 0;
    submitInfo.commandBufferCount = 1;
    submitInfo._44_4_ = 0;
    submitInfo.pCommandBuffers = &commandBuffer_local;
    VVar1 = (*vk->_vptr_DeviceInterface[2])
                      (vk,queue,1,&submitInfo,local_e8.m_data.object.m_internal);
    ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x279);
    VVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_e8,0,0xffffffffffffffff);
    ::vk::checkResult(VVar1,"vk.waitForFences(device, 1u, &fence.get(), 0u, INFINITE_TIMEOUT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x27b);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(&local_e8);
    iVar2 = (*vk->_vptr_DeviceInterface[0x1b])(vk,device,local_c8.m_data.object.m_internal);
    bVar3 = iVar2 == 3;
  }
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase(&local_c8);
  return bVar3;
}

Assistant:

bool executeCommandBuffer (const VkDevice			device,
						   const DeviceInterface&	vk,
						   const VkQueue			queue,
						   const VkCommandBuffer	commandBuffer,
						   const bool				exitBeforeEndCommandBuffer = false)
{
	const Unique<VkEvent>			event					(createEvent(vk, device));
	const VkCommandBufferBeginInfo	commandBufferBeginInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	//VkStructureType						sType;
		DE_NULL,										//const void*							pNext;
		0u,												//VkCommandBufferUsageFlags				flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL	//const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
	};

	VK_CHECK(vk.beginCommandBuffer(commandBuffer, &commandBufferBeginInfo));
	{
		const VkPipelineStageFlags stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;
		vk.cmdSetEvent(commandBuffer, *event, stageMask);
		if (exitBeforeEndCommandBuffer)
			return exitBeforeEndCommandBuffer;
	}
	VK_CHECK(vk.endCommandBuffer(commandBuffer));

	{
		const Unique<VkFence>					fence			(createFence(vk, device));
		const VkSubmitInfo						submitInfo		=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,			// sType
			DE_NULL,								// pNext
			0u,										// waitSemaphoreCount
			DE_NULL,								// pWaitSemaphores
			(const VkPipelineStageFlags*)DE_NULL,	// pWaitDstStageMask
			1u,										// commandBufferCount
			&commandBuffer,							// pCommandBuffers
			0u,										// signalSemaphoreCount
			DE_NULL									// pSignalSemaphores
		};

		// Submit the command buffer to the queue
		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
		// wait for end of execution of queue
		VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), 0u, INFINITE_TIMEOUT));
	}
	// check if buffer has been executed
	const VkResult result = vk.getEventStatus(device, *event);
	return result == VK_EVENT_SET;
}